

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChVector<double>_>::SetRawPtr
          (ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this,void *mptr)

{
  ChExceptionArchive *this_00;
  allocator local_39;
  string local_38;
  void *local_18;
  void *mptr_local;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this_local;
  
  local_18 = mptr;
  mptr_local = this;
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot call SetRawPtr() for a constructed object.",&local_39);
  ChExceptionArchive::ChExceptionArchive(this_00,&local_38);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
}

Assistant:

virtual void* GetRawPtr() 
        { return static_cast<void*>(pt2Object); }